

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

_Bool Curl_conn_cf_is_ssl(Curl_cfilter *cf)

{
  Curl_cfilter *local_18;
  Curl_cfilter *cf_local;
  
  local_18 = cf;
  while( true ) {
    if (local_18 == (Curl_cfilter *)0x0) {
      return false;
    }
    if ((local_18->cft->flags & 2U) != 0) break;
    if ((local_18->cft->flags & 1U) != 0) {
      return false;
    }
    local_18 = local_18->next;
  }
  return true;
}

Assistant:

bool Curl_conn_cf_is_ssl(struct Curl_cfilter *cf)
{
  for(; cf; cf = cf->next) {
    if(cf->cft->flags & CF_TYPE_SSL)
      return TRUE;
    if(cf->cft->flags & CF_TYPE_IP_CONNECT)
      return FALSE;
  }
  return FALSE;
}